

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O2

int __thiscall
QCommonStyle::pixelMetric(QCommonStyle *this,PixelMetric m,QStyleOption *opt,QWidget *widget)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QSidebar *this_00;
  QStyle *pQVar4;
  QStyleOptionTitleBar *pQVar5;
  QStyleOptionSlider *pQVar6;
  QStyleOptionTab *pQVar7;
  long lVar8;
  QDockWidget *pQVar9;
  code *UNRECOVERED_JUMPTABLE;
  long in_FS_OFFSET;
  bool bVar10;
  qreal qVar11;
  undefined8 uStack_60;
  QWidget local_50;
  
  local_50.data = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if (PM_LineEditIconMargin < m) {
switchD_003274ad_caseD_1:
    iVar1 = 0;
    goto switchD_003274ad_caseD_3;
  }
  iVar1 = 2;
  this_00 = (QSidebar *)
            ((long)&switchD_003274ad::switchdataD_005ebfec +
            (long)(int)(&switchD_003274ad::switchdataD_005ebfec)[m]);
  switch(m) {
  case PM_ButtonMargin:
  case PM_DockWidgetSeparatorExtent:
  case PM_ToolBarSeparatorExtent:
  case PM_CheckBoxLabelSpacing:
  case PM_RadioButtonLabelSpacing:
  case PM_LayoutHorizontalSpacing:
  case PM_LayoutVerticalSpacing:
    qVar11 = 6.0;
    break;
  default:
    goto switchD_003274ad_caseD_1;
  case PM_MenuButtonIndicator:
  case PM_ExclusiveIndicatorWidth:
  case PM_ExclusiveIndicatorHeight:
  case PM_ToolBarExtensionExtent:
    qVar11 = 12.0;
    break;
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
  case PM_DefaultFrameWidth:
  case PM_MenuBarPanelWidth:
  case PM_TabBarTabShiftVertical:
  case PM_SpinBoxSliderHeight:
  case PM_FocusFrameVMargin:
  case PM_FocusFrameHMargin:
    goto switchD_003274ad_caseD_3;
  case PM_SpinBoxFrameWidth:
  case PM_ComboBoxFrameWidth:
  case PM_TabBarBaseHeight:
  case PM_TabBarBaseOverlap:
  case PM_MenuPanelWidth:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar4 + 0xe0);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) != local_50.data) goto LAB_003279e2;
    uStack_60 = 5;
    goto LAB_00327754;
  case PM_MaximumDragDistance:
    lVar8 = *QGuiApplicationPrivate::platform_theme;
    uStack_60 = 10;
    goto LAB_003277c2;
  case PM_ScrollBarExtent:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(opt);
    if (pQVar6 == (QStyleOptionSlider *)0x0) goto switchD_003274ad_caseD_b;
    iVar1 = 0x10;
    goto switchD_003274ad_caseD_3;
  case PM_ScrollBarSliderMin:
switchD_003274ad_caseD_a:
    qVar11 = 9.0;
    break;
  case PM_SliderThickness:
  case PM_HeaderMarkSize:
  case PM_TabBarScrollButtonWidth:
  case PM_SmallIconSize:
  case PM_ButtonIconSize:
  case PM_TabCloseIndicatorWidth:
  case PM_TabCloseIndicatorHeight:
  case PM_TitleBarButtonIconSize:
  case PM_TitleBarButtonSize:
switchD_003274ad_caseD_b:
    qVar11 = 16.0;
    break;
  case PM_SliderTickmarkOffset:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(opt);
    iVar1 = 0;
    if (pQVar6 != (QStyleOptionSlider *)0x0) {
      pQVar4 = (QStyle *)(ulong)(pQVar6->orientation == Horizontal);
      iVar2 = ((&(pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.x2)[(long)pQVar4].m_i -
              (&(pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.x1)[(long)pQVar4].m_i) +
              1;
      pQVar4 = QStyle::proxy(pQVar4);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0xc,pQVar6,widget);
      if (pQVar6->tickPosition == TicksAbove) {
        iVar1 = iVar2 - iVar3;
      }
      else if (pQVar6->tickPosition == TicksBothSides) {
        iVar1 = iVar2 - iVar3;
        iVar3 = 2;
        goto LAB_003275fb;
      }
    }
    goto switchD_003274ad_caseD_3;
  case PM_SliderSpaceAvailable:
    pQVar6 = qstyleoption_cast<QStyleOptionSlider_const*>(opt);
    if (pQVar6 == (QStyleOptionSlider *)0x0) goto switchD_003274ad_caseD_1;
    if (pQVar6->orientation == Horizontal) {
      iVar1 = (pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.x1.m_i;
      iVar3 = (pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.x2.m_i;
    }
    else {
      iVar1 = (pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.y1.m_i;
      iVar3 = (pQVar6->super_QStyleOptionComplex).super_QStyleOption.rect.y2.m_i;
    }
    pQVar4 = QStyle::proxy((QStyle *)pQVar6);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0xd,pQVar6,widget);
    iVar1 = (iVar3 - (iVar2 + iVar1)) + 1;
    goto switchD_003274ad_caseD_3;
  case PM_DockWidgetHandleExtent:
  case PM_ToolBarHandleExtent:
    qVar11 = 8.0;
    break;
  case PM_DockWidgetFrameWidth:
    qVar11 = 1.0;
    break;
  case PM_TabBarTabOverlap:
switchD_003274ad_caseD_13:
    iVar1 = 3;
    goto switchD_003274ad_caseD_3;
  case PM_TabBarTabHSpace:
    goto switchD_003274ad_caseD_14;
  case PM_TabBarTabVSpace:
    pQVar7 = qstyleoption_cast<QStyleOptionTab_const*>(opt);
    if (pQVar7 != (QStyleOptionTab *)0x0) {
      if (pQVar7->shape < TriangularNorth) {
        iVar1 = 8;
      }
      else if ((pQVar7->shape & ~RoundedSouth) == TriangularWest) goto switchD_003274ad_caseD_13;
    }
    goto switchD_003274ad_caseD_3;
  case PM_ProgressBarChunkWidth:
    iVar1 = 9;
    goto switchD_003274ad_caseD_3;
  case PM_TitleBarHeight:
    pQVar5 = qstyleoption_cast<QStyleOptionTitleBar_const*>(opt);
    if (pQVar5 == (QStyleOptionTitleBar *)0x0) {
      qVar11 = 18.0;
      break;
    }
    if ((char)(pQVar5->titleBarFlags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
              super_QFlagsStorage<Qt::WindowType>.i == '\v') {
      if (widget == (QWidget *)0x0) {
        iVar1 = QFontMetrics::height();
        if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.data) {
          bVar10 = SBORROW4(iVar1,0x11);
          iVar3 = iVar1 + -0x11;
          iVar2 = 0x10;
LAB_003279d7:
          if (bVar10 != iVar3 < 0) {
            return iVar2;
          }
          return iVar1;
        }
        goto LAB_003279e2;
      }
      QWidget::fontMetrics(&local_50);
      iVar2 = QFontMetrics::height();
      bVar10 = SBORROW4(iVar2,0x11);
      iVar3 = iVar2 + -0x11;
      iVar1 = 0x10;
LAB_003279a5:
      if (bVar10 == iVar3 < 0) {
        iVar1 = iVar2;
      }
    }
    else {
      pQVar9 = QtPrivate::qobject_cast_helper<QDockWidget_const*,QObject_const>
                         (&widget->super_QObject);
      if (pQVar9 == (QDockWidget *)0x0) {
        if (widget == (QWidget *)0x0) {
          iVar1 = QFontMetrics::height();
          if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.data) {
            bVar10 = SBORROW4(iVar1,0x13);
            iVar3 = iVar1 + -0x13;
            iVar2 = 0x12;
            goto LAB_003279d7;
          }
          goto LAB_003279e2;
        }
        QWidget::fontMetrics(&local_50);
        iVar2 = QFontMetrics::height();
        bVar10 = SBORROW4(iVar2,0x13);
        iVar3 = iVar2 + -0x13;
        iVar1 = 0x12;
        goto LAB_003279a5;
      }
      QWidget::fontMetrics(&local_50);
      iVar3 = QFontMetrics::height();
      qVar11 = QStyleHelper::dpiScaled(13.0,opt);
      iVar1 = (int)qVar11;
      if ((int)qVar11 < iVar3) {
        iVar1 = iVar3;
      }
    }
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
    goto switchD_003274ad_caseD_3;
  case PM_MenuScrollerHeight:
  case PM_MenuTearoffHeight:
    qVar11 = 10.0;
    break;
  case PM_IndicatorWidth:
  case PM_IndicatorHeight:
  case PM_SizeGripSize:
    qVar11 = 13.0;
    break;
  case PM_MdiSubWindowFrameWidth:
  case PM_HeaderMargin:
  case PM_HeaderGripMargin:
  case PM_ToolBarItemSpacing:
    qVar11 = 4.0;
    break;
  case PM_MdiSubWindowMinimizedWidth:
    qVar11 = 196.0;
    break;
  case PM_ToolBarFrameWidth:
  case PM_ToolTipLabelFrameWidth:
  case PM_TabBar_ScrollButtonOverlap:
    iVar1 = 1;
    goto switchD_003274ad_caseD_3;
  case PM_ToolBarIconSize:
    if (QGuiApplicationPrivate::platform_theme != (long *)0x0) {
      (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x60))
                (&local_50,QGuiApplicationPrivate::platform_theme,0xc);
      iVar1 = ::QVariant::toInt((bool *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
      if (0 < iVar1) goto switchD_003274ad_caseD_3;
    }
    goto switchD_003274ad_caseD_14;
  case PM_ListViewIconSize:
    this_00 = QtPrivate::qobject_cast_helper<QSidebar_const*,QObject_const>(&widget->super_QObject);
    if (this_00 == (QSidebar *)0x0) goto switchD_003274ad_caseD_44;
switchD_003274ad_caseD_14:
    qVar11 = 24.0;
    break;
  case PM_IconViewIconSize:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar4 + 0xe0);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.data) {
      uStack_60 = 0x3f;
      goto LAB_00327754;
    }
    goto LAB_003279e2;
  case PM_LargeIconSize:
  case PM_MessageBoxIconSize:
    qVar11 = 32.0;
    break;
  case PM_TabBarIconSize:
  case PM_LineEditIconSize:
switchD_003274ad_caseD_44:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)pQVar4 + 0xe0);
    if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.data) {
      uStack_60 = 0x3e;
LAB_00327754:
      iVar1 = (*UNRECOVERED_JUMPTABLE)(pQVar4,uStack_60,opt,widget,UNRECOVERED_JUMPTABLE);
      return iVar1;
    }
    goto LAB_003279e2;
  case PM_DockWidgetTitleBarButtonMargin:
    qVar11 = 2.0;
    break;
  case PM_LayoutLeftMargin:
  case PM_LayoutTopMargin:
  case PM_LayoutRightMargin:
  case PM_LayoutBottomMargin:
    if (opt == (QStyleOption *)0x0) {
      qVar11 = 9.0;
      if ((widget != (QWidget *)0x0) &&
         (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) goto LAB_0032757f;
    }
    else {
      if (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i >> 0x11 & 1) == 0)
      goto switchD_003274ad_caseD_a;
LAB_0032757f:
      qVar11 = 11.0;
    }
    break;
  case PM_TextCursorWidth:
    lVar8 = *QGuiApplicationPrivate::platform_theme;
    uStack_60 = 8;
LAB_003277c2:
    (**(code **)(lVar8 + 0x60))(&local_50,QGuiApplicationPrivate::platform_theme,uStack_60);
    iVar1 = ::QVariant::toInt((bool *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    goto switchD_003274ad_caseD_3;
  case PM_ScrollView_ScrollBarSpacing:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,opt,widget);
    iVar1 = iVar1 * 2;
    goto switchD_003274ad_caseD_3;
  case PM_SubMenuOverlap:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x1e,opt,widget);
    iVar1 = -iVar1;
    goto switchD_003274ad_caseD_3;
  case PM_TreeViewIndentation:
    qVar11 = 20.0;
    break;
  case PM_HeaderDefaultSectionSizeHorizontal:
    qVar11 = 100.0;
    break;
  case PM_HeaderDefaultSectionSizeVertical:
    qVar11 = 30.0;
    break;
  case PM_LineEditIconMargin:
    pQVar4 = QStyle::proxy((QStyle *)this_00);
    iVar1 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x5d,opt,widget);
    iVar3 = 4;
LAB_003275fb:
    iVar1 = iVar1 / iVar3;
    goto switchD_003274ad_caseD_3;
  }
  qVar11 = QStyleHelper::dpiScaled(qVar11,opt);
  iVar1 = (int)qVar11;
switchD_003274ad_caseD_3:
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_50.data) {
    return iVar1;
  }
LAB_003279e2:
  __stack_chk_fail();
}

Assistant:

int QCommonStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *widget) const
{
    int ret;

    switch (m) {
    case PM_FocusFrameVMargin:
    case PM_FocusFrameHMargin:
        ret = 2;
        break;
    case PM_MenuBarVMargin:
    case PM_MenuBarHMargin:
        ret = 0;
        break;
    case PM_TitleBarHeight:
    {
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(opt)) {
            if ((tb->titleBarFlags & Qt::WindowType_Mask) == Qt::Tool) {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 16);
#if QT_CONFIG(dockwidget)
            } else if (qobject_cast<const QDockWidget*>(widget)) {
                ret = qMax(widget->fontMetrics().height(), int(QStyleHelper::dpiScaled(13, opt)));
#endif
            } else {
                ret = qMax(widget ? widget->fontMetrics().height() : opt->fontMetrics.height(), 18);
            }
        } else {
            ret = int(QStyleHelper::dpiScaled(18., opt));
        }
        break;
    }
    case PM_TitleBarButtonSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;
    case PM_TitleBarButtonIconSize:
        ret = int(QStyleHelper::dpiScaled(16., opt));
        break;

    case PM_ScrollBarSliderMin:
        ret = int(QStyleHelper::dpiScaled(9., opt));
        break;

    case PM_ButtonMargin:
        ret = int(QStyleHelper::dpiScaled(6., opt));
        break;

    case PM_DockWidgetTitleBarButtonMargin:
        ret = int(QStyleHelper::dpiScaled(2., opt));
        break;

    case PM_ButtonDefaultIndicator:
        ret = 0;
        break;

    case PM_MenuButtonIndicator:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:

    case PM_DefaultFrameWidth:
        ret = 2;
        break;

    case PM_ComboBoxFrameWidth:
    case PM_SpinBoxFrameWidth:
    case PM_MenuPanelWidth:
    case PM_TabBarBaseOverlap:
    case PM_TabBarBaseHeight:
        ret = proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;

    case PM_MdiSubWindowFrameWidth:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_MdiSubWindowMinimizedWidth:
        ret = int(QStyleHelper::dpiScaled(196, opt));
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (qstyleoption_cast<const QStyleOptionSlider *>(opt))
            ret = 16;
        else
            ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
#endif
    case PM_MaximumDragDistance:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::MaximumScrollBarDragDistance).toInt();
        break;

#if QT_CONFIG(slider)
    case PM_SliderThickness:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;

    case PM_SliderTickmarkOffset:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            int space = (sl->orientation == Qt::Horizontal) ? sl->rect.height()
                                                            : sl->rect.width();
            int thickness = proxy()->pixelMetric(PM_SliderControlThickness, sl, widget);
            int ticks = sl->tickPosition;

            if (ticks == QSlider::TicksBothSides)
                ret = (space - thickness) / 2;
            else if (ticks == QSlider::TicksAbove)
                ret = space - thickness;
            else
                ret = 0;
        } else {
            ret = 0;
        }
        break;

    case PM_SliderSpaceAvailable:
        if (const QStyleOptionSlider *sl = qstyleoption_cast<const QStyleOptionSlider *>(opt)) {
            if (sl->orientation == Qt::Horizontal)
                ret = sl->rect.width() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
            else
                ret = sl->rect.height() - proxy()->pixelMetric(PM_SliderLength, sl, widget);
        } else {
            ret = 0;
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(dockwidget)
    case PM_DockWidgetSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_DockWidgetHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;
    case PM_DockWidgetTitleMargin:
        ret = 0;
        break;
    case PM_DockWidgetFrameWidth:
        ret = int(QStyleHelper::dpiScaled(1, opt));
        break;
#endif // QT_CONFIG(dockwidget)

    case PM_SpinBoxSliderHeight:
    case PM_MenuBarPanelWidth:
        ret = 2;
        break;

    case PM_MenuBarItemSpacing:
        ret = 0;
        break;

#if QT_CONFIG(toolbar)
    case PM_ToolBarFrameWidth:
        ret = 1;
        break;

    case PM_ToolBarItemMargin:
        ret = 0;
        break;

    case PM_ToolBarItemSpacing:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;

    case PM_ToolBarHandleExtent:
        ret = int(QStyleHelper::dpiScaled(8, opt));
        break;

    case PM_ToolBarSeparatorExtent:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarExtensionExtent:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;
#endif // QT_CONFIG(toolbar)

#if QT_CONFIG(tabbar)
    case PM_TabBarTabOverlap:
        ret = 3;
        break;

    case PM_TabBarTabHSpace:
        ret = int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarTabShiftHorizontal:
        ret = 0;
        break;

    case PM_TabBarTabShiftVertical:
        ret = 2;
        break;

    case PM_TabBarTabVSpace:
    {
        const QStyleOptionTab *tb = qstyleoption_cast<const QStyleOptionTab *>(opt);
        if (tb && (tb->shape == QTabBar::RoundedNorth || tb->shape == QTabBar::RoundedSouth
                   || tb->shape == QTabBar::RoundedWest || tb->shape == QTabBar::RoundedEast))
            ret = 8;
        else
            if (tb && (tb->shape == QTabBar::TriangularWest || tb->shape == QTabBar::TriangularEast))
                ret = 3;
            else
                ret = 2;
        break;
    }
#endif

    case PM_ProgressBarChunkWidth:
        ret = 9;
        break;

    case PM_IndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_IndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;

    case PM_ExclusiveIndicatorWidth:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_ExclusiveIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(12, opt));
        break;

    case PM_MenuTearoffHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuScrollerHeight:
        ret = int(QStyleHelper::dpiScaled(10, opt));
        break;

    case PM_MenuDesktopFrameWidth:
    case PM_MenuHMargin:
    case PM_MenuVMargin:
        ret = 0;
        break;

    case PM_HeaderMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderMarkSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_HeaderGripMargin:
        ret = int(QStyleHelper::dpiScaled(4, opt));
        break;
    case PM_HeaderDefaultSectionSizeHorizontal:
        ret = int(QStyleHelper::dpiScaled(100, opt));
        break;
    case PM_HeaderDefaultSectionSizeVertical:
        ret = int(QStyleHelper::dpiScaled(30, opt));
        break;
    case PM_TabBarScrollButtonWidth:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_LayoutLeftMargin:
    case PM_LayoutTopMargin:
    case PM_LayoutRightMargin:
    case PM_LayoutBottomMargin:
    {
        bool isWindow = false;
        if (opt) {
            isWindow = (opt->state & State_Window);
        } else if (widget) {
            isWindow = widget->isWindow();
        }
        ret = int(QStyleHelper::dpiScaled(isWindow ? 11 : 9, opt));
        break;
    }
    case PM_LayoutHorizontalSpacing:
    case PM_LayoutVerticalSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;

    case PM_ToolBarIconSize:
        ret = 0;
        if (const QPlatformTheme *theme = QGuiApplicationPrivate::platformTheme())
            ret = theme->themeHint(QPlatformTheme::ToolBarIconSize).toInt();
        if (ret <= 0)
            ret =  int(QStyleHelper::dpiScaled(24, opt));
        break;

    case PM_TabBarIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_ListViewIconSize:
#if QT_CONFIG(filedialog)
        if (qobject_cast<const QSidebar *>(widget))
            ret = int(QStyleHelper::dpiScaled(24., opt));
        else
#endif
            ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;

    case PM_ButtonIconSize:
    case PM_SmallIconSize:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_IconViewIconSize:
        ret = proxy()->pixelMetric(PM_LargeIconSize, opt, widget);
        break;
    case PM_LineEditIconSize:
        ret = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
        break;
    case PM_LineEditIconMargin:
        ret = proxy()->pixelMetric(PM_LineEditIconSize, opt, widget) / 4;
        break;

    case PM_LargeIconSize:
        ret = int(QStyleHelper::dpiScaled(32, opt));
        break;

    case PM_ToolTipLabelFrameWidth:
        ret = 1;
        break;
    case PM_CheckBoxLabelSpacing:
    case PM_RadioButtonLabelSpacing:
        ret = int(QStyleHelper::dpiScaled(6, opt));
        break;
    case PM_SizeGripSize:
        ret = int(QStyleHelper::dpiScaled(13, opt));
        break;
    case PM_MessageBoxIconSize:
#ifdef Q_OS_MAC
        if (QGuiApplication::desktopSettingsAware()) {
            ret = 64; // No DPI scaling, it's handled elsewhere.
        } else
#endif
        {
            ret = int(QStyleHelper::dpiScaled(32, opt));
        }
        break;
    case PM_TextCursorWidth:
        ret = QGuiApplicationPrivate::platformTheme()->themeHint(QPlatformTheme::TextCursorWidth).toInt();
        break;
    case PM_TabBar_ScrollButtonOverlap:
        ret = 1;
        break;
    case PM_TabCloseIndicatorWidth:
    case PM_TabCloseIndicatorHeight:
        ret = int(QStyleHelper::dpiScaled(16, opt));
        break;
    case PM_ScrollView_ScrollBarSpacing:
        ret = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, opt, widget);
        break;
    case PM_ScrollView_ScrollBarOverlap:
        ret = 0;
        break;
    case PM_SubMenuOverlap:
        ret = -proxy()->pixelMetric(QStyle::PM_MenuPanelWidth, opt, widget);
        break;
    case PM_TreeViewIndentation:
        ret = int(QStyleHelper::dpiScaled(20, opt));
        break;
    default:
        ret = 0;
        break;
    }

    return ret;
}